

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RollupOutput::PrettyPrintRow
          (RollupOutput *this,RollupRow *row,size_t indent,OutputOptions *options,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  OutputOptions *in_RCX;
  string *in_RSI;
  long in_RDI;
  ostream *in_R8;
  bool in_stack_00000077;
  int64_t in_stack_00000078;
  size_t in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  allocator<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string *psVar4;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [31];
  undefined1 in_stack_ffffffffffffffd7;
  
  if ((in_RSI == (string *)(in_RDI + 0x18)) ||
     (((bVar1 = anon_unknown_33::ShowFile(in_RCX), bVar1 || (*(long *)(in_RSI + 0x20) != 0)) &&
      ((bVar1 = anon_unknown_33::ShowVM(in_RCX), bVar1 || (*(long *)(in_RSI + 0x28) != 0)))))) {
    poVar3 = in_R8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    anon_unknown_33::FixedWidthString(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    poVar2 = std::operator<<(in_R8,local_48);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    bVar1 = anon_unknown_33::ShowFile(in_RCX);
    if (bVar1) {
      psVar4 = local_a0;
      poVar2 = poVar3;
      (anonymous_namespace)::PercentString_abi_cxx11_
                ((double)poVar3,(bool)in_stack_ffffffffffffffd7);
      poVar3 = std::operator<<(poVar3,psVar4);
      poVar3 = std::operator<<(poVar3," ");
      (anonymous_namespace)::SiPrint_abi_cxx11_(in_stack_00000078,in_stack_00000077);
      poVar3 = std::operator<<(poVar3,local_c0);
      std::operator<<(poVar3," ");
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      poVar3 = poVar2;
    }
    bVar1 = anon_unknown_33::ShowVM(in_RCX);
    if (bVar1) {
      poVar2 = poVar3;
      (anonymous_namespace)::PercentString_abi_cxx11_
                ((double)poVar3,(bool)in_stack_ffffffffffffffd7);
      poVar3 = std::operator<<(poVar3,local_e0);
      poVar3 = std::operator<<(poVar3," ");
      (anonymous_namespace)::SiPrint_abi_cxx11_(in_stack_00000078,in_stack_00000077);
      poVar3 = std::operator<<(poVar3,local_100);
      std::operator<<(poVar3," ");
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_e0);
      poVar3 = poVar2;
    }
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = std::operator<<(poVar3,in_RSI);
    std::operator<<(poVar3,"\n");
  }
  return;
}

Assistant:

void RollupOutput::PrettyPrintRow(const RollupRow& row, size_t indent,
                                  const OutputOptions& options,
                                  std::ostream* out) const {
  if (&row != &toplevel_row_) {
    // Avoid printing this row if it is only zero.
    // This can happen when using --domain if the row is zero for this domain.
    if ((!ShowFile(options) && row.size.vm == 0) ||
        (!ShowVM(options) && row.size.file == 0)) {
      return;
    }
  }

  *out << FixedWidthString("", indent) << " ";

  if (ShowFile(options)) {
    *out << PercentString(row.filepercent, diff_mode_) << " "
         << SiPrint(row.size.file, diff_mode_) << " ";
  }

  if (ShowVM(options)) {
    *out << PercentString(row.vmpercent, diff_mode_) << " "
         << SiPrint(row.size.vm, diff_mode_) << " ";
  }

  *out << "   " << row.name << "\n";
}